

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt5
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  byte bVar1;
  byte bVar2;
  params *ppVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint64 s;
  long lVar12;
  int iVar13;
  uint uVar14;
  uint16 uVar15;
  ushort uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint16 uVar21;
  ushort uVar22;
  uint uVar23;
  uint64 DD [8];
  uint64 D2 [8];
  uint64 hist [8];
  uint values [8];
  uint16 solutions [529];
  
  uVar9 = (uint)(low_color->m_s[0] * 256.0);
  if (0xfe < (int)uVar9) {
    uVar9 = 0xff;
  }
  uVar11 = (uint)(high_color->m_s[0] * 256.0);
  uVar14 = 0xff;
  if ((int)uVar11 < 0xff) {
    uVar14 = uVar11;
  }
  hist[6] = 0;
  hist[7] = 0;
  hist[4] = 0;
  hist[5] = 0;
  hist[2] = 0;
  hist[3] = 0;
  hist[0] = 0;
  hist[1] = 0;
  D2[6] = 0;
  D2[7] = 0;
  D2[4] = 0;
  D2[5] = 0;
  D2[2] = 0;
  D2[3] = 0;
  D2[0] = 0;
  D2[1] = 0;
  DD[6] = 0;
  DD[7] = 0;
  DD[4] = 0;
  DD[5] = 0;
  DD[2] = 0;
  DD[3] = 0;
  DD[0] = 0;
  DD[1] = 0;
  ppVar3 = this->m_pParams;
  uVar11 = ppVar3->m_num_pixels;
  uVar17 = ppVar3->m_alpha_comp_index;
  for (uVar18 = 0; uVar11 != uVar18; uVar18 = uVar18 + 1) {
    bVar1 = ppVar3->m_pPixels[uVar18].field_0.c[uVar17];
    bVar2 = ppVar3->m_pSelectors[uVar18];
    hist[bVar2] = hist[bVar2] + 1;
    D2[bVar2] = D2[bVar2] + (ulong)((uint)bVar1 + (uint)bVar1);
    DD[bVar2] = DD[bVar2] + (ulong)((uint)bVar1 * (uint)bVar1);
  }
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  uVar11 = 0;
  if (0 < (int)uVar14) {
    uVar11 = uVar14;
  }
  uVar14 = uVar9 & 0xff;
  uVar17 = uVar11 & 0xff;
  if (uVar14 == uVar17) {
    if ((uVar9 & 0xff) == 0) {
      solutions[0] = 1;
    }
    else {
      solutions[0] = ((short)(uVar14 << 8) + (ushort)uVar14) - 0x100;
    }
  }
  else if (uVar17 < uVar14) {
    solutions[0] = (ushort)(uVar17 << 8) | (ushort)uVar14;
  }
  else {
    solutions[0] = (ushort)(uVar14 << 8) | (ushort)uVar17;
  }
  uVar18 = 1;
  uVar4 = uVar9 + 0xf5;
  if (uVar14 < 0xc) {
    uVar4 = 0;
  }
  uVar8 = (short)uVar9 + 0xbU & 0xff;
  uVar5 = uVar11 + 0xf5 & 0xff;
  if (uVar17 < 0xc) {
    uVar5 = 0;
  }
  uVar6 = uVar11 + 0xb & 0xff;
  if (0xf3 < uVar17) {
    uVar6 = 0xff;
  }
  if (0xf3 < uVar14) {
    uVar8 = 0xff;
  }
  for (uVar23 = uVar4 & 0xff; uVar22 = (ushort)uVar23, uVar22 <= uVar8; uVar23 = uVar23 + 1) {
    uVar19 = uVar23 & 0xffff;
    uVar15 = uVar22 * 0x100 - 0x100 | uVar22;
    iVar13 = uVar5 << 8;
    uVar7 = uVar5;
    if (uVar22 == 0) {
      uVar15 = 1;
    }
    for (; uVar16 = (ushort)uVar7, uVar16 <= (ushort)uVar6; uVar7 = uVar7 + 1) {
      uVar20 = uVar18;
      if (((uVar22 <= uVar16 || (uVar16 < (ushort)(uVar4 & 0xff) || uVar6 < uVar19)) &&
          (uVar11 != uVar7 || uVar14 != uVar19)) && (uVar9 != uVar7 || uVar17 != uVar19)) {
        uVar21 = uVar15;
        if (uVar22 != uVar16) {
          if (uVar16 < uVar22) {
            uVar21 = (ushort)iVar13 | uVar22;
          }
          else {
            uVar21 = uVar16 | uVar22 * 0x100;
          }
        }
        uVar20 = (ulong)((int)uVar18 + 1);
        solutions[uVar18] = uVar21;
      }
      uVar18 = uVar20;
      iVar13 = iVar13 + 0x100;
    }
  }
  uVar20 = 0;
  do {
    if (uVar20 == uVar18) {
      return;
    }
    uVar8 = solutions[uVar20];
    dxt5_block::get_block_values8(values,(uint)(byte)uVar8,(uint)(uVar8 >> 8));
    uVar10 = 0;
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
      uVar10 = uVar10 + DD[lVar12] +
               (hist[lVar12] * (ulong)values[lVar12] - D2[lVar12]) * (ulong)values[lVar12];
    }
    if (uVar10 < this->m_pResults->m_error) {
      this->m_pResults->m_low_color = uVar8 & 0xff;
      this->m_pResults->m_high_color = uVar8 >> 8;
      this->m_pResults->m_error = uVar10;
      if (this->m_pResults->m_error == 0) {
        return;
      }
    }
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt5(vec3F low_color, vec3F high_color) {
  uint8 L0 = math::clamp<int>(low_color[0] * 256.0f, 0, 255);
  uint8 H0 = math::clamp<int>(high_color[0] * 256.0f, 0, 255);

  uint64 hist[8] = {}, D2[8] = {}, DD[8] = {};
  for (uint c = m_pParams->m_alpha_comp_index, i = 0; i < m_pParams->m_num_pixels; i++) {
    uint8 a = m_pParams->m_pPixels[i][c];
    uint8 s = m_pParams->m_pSelectors[i];
    hist[s]++;
    D2[s] += a * 2;
    DD[s] += a * a;
  }

  uint16 solutions[529];
  uint solutions_count = 0;
  solutions[solutions_count++] = L0 == H0 ? H0 ? H0 - 1 << 8 | L0 : 1 : L0 > H0 ? H0 << 8 | L0 : L0 << 8 | H0;
  uint8 minL = L0 <= 11 ? 0 : L0 - 11, maxL = L0 >= 244 ? 255 : L0 + 11;
  uint8 minH = H0 <= 11 ? 0 : H0 - 11, maxH = H0 >= 244 ? 255 : H0 + 11;
  for (uint16 L = minL; L <= maxL; L++) {
    for (uint16 H = minH; H <= maxH; H++) {
      if ((maxH < L || L <= H || H < minL) && (L != L0 || H != H0) && (L != H0 || H != L0))
        solutions[solutions_count++] = L == H ? H ? H - 1 << 8 | L : 1 : L > H ? H << 8 | L : L << 8 | H;
    }
  }

  for (uint i = 0; i < solutions_count; i++) {
    uint8 L = solutions[i] & 0xFF;
    uint8 H = solutions[i] >> 8;
    uint values[8];
    dxt5_block::get_block_values8(values, L, H);
    uint64 error = 0;
    for (uint64 s = 0; s < 8; s++)
      error += hist[s] * values[s] * values[s] - D2[s] * values[s] + DD[s];
    if (error < m_pResults->m_error) {
      m_pResults->m_low_color = L;
      m_pResults->m_high_color = H;
      m_pResults->m_error = error;
      if (!m_pResults->m_error)
        return;
    }
  }
}